

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O3

void __thiscall
cmServer::WriteJsonObject(cmServer *this,cmConnection *connection,Value *jsonValue,DebugInfo *debug)

{
  uint64_t uVar1;
  uint64_t uVar2;
  long lVar3;
  Value *pVVar4;
  DebugInfo *__n;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  string result;
  Value copy;
  FastWriter writer;
  Value stats;
  undefined1 local_380 [32];
  undefined1 local_360 [72];
  FastWriter local_318;
  Value local_2e8;
  Value local_2c0;
  Value local_298;
  Value local_270;
  Value local_248;
  ValueHolder local_220;
  filebuf local_218 [240];
  ios_base local_128 [264];
  
  __n = debug;
  Json::FastWriter::FastWriter(&local_318);
  uVar1 = uv_hrtime();
  Json::FastWriter::write_abi_cxx11_((FastWriter *)local_380,(int)&local_318,jsonValue,(size_t)__n);
  if (debug != (DebugInfo *)0x0) {
    Json::Value::Value((Value *)(local_360 + 0x20),jsonValue);
    if (debug->PrintStatistics == true) {
      Json::Value::Value((Value *)&local_220,objectValue);
      uVar2 = uv_hrtime();
      lVar3 = uVar2 - uVar1;
      auVar5._8_4_ = (int)((ulong)lVar3 >> 0x20);
      auVar5._0_8_ = lVar3;
      auVar5._12_4_ = 0x45300000;
      Json::Value::Value(&local_248,
                         ((auVar5._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) / 1000000.0
                        );
      pVVar4 = Json::Value::operator[]((Value *)&local_220,"jsonSerialization");
      Json::Value::operator=(pVVar4,&local_248);
      Json::Value::~Value(&local_248);
      lVar3 = uVar2 - debug->StartTime;
      auVar6._8_4_ = (int)((ulong)lVar3 >> 0x20);
      auVar6._0_8_ = lVar3;
      auVar6._12_4_ = 0x45300000;
      Json::Value::Value(&local_270,
                         ((auVar6._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0)) / 1000000.0
                        );
      pVVar4 = Json::Value::operator[]((Value *)&local_220,"totalTime");
      Json::Value::operator=(pVVar4,&local_270);
      Json::Value::~Value(&local_270);
      Json::Value::Value(&local_298,local_380._8_4_);
      pVVar4 = Json::Value::operator[]((Value *)&local_220,"size");
      Json::Value::operator=(pVVar4,&local_298);
      Json::Value::~Value(&local_298);
      if ((debug->OutputFile)._M_string_length != 0) {
        Json::Value::Value(&local_2c0,&debug->OutputFile);
        pVVar4 = Json::Value::operator[]((Value *)&local_220,"dumpFile");
        Json::Value::operator=(pVVar4,&local_2c0);
        Json::Value::~Value(&local_2c0);
      }
      Json::Value::Value(&local_2e8,(Value *)&local_220);
      pVVar4 = Json::Value::operator[]((Value *)(local_360 + 0x20),"zzzDebug");
      Json::Value::operator=(pVVar4,&local_2e8);
      Json::Value::~Value(&local_2e8);
      Json::FastWriter::write_abi_cxx11_
                ((FastWriter *)local_360,(int)&local_318,local_360 + 0x20,(size_t)__n);
      std::__cxx11::string::operator=((string *)local_380,(string *)local_360);
      if ((undefined1 *)local_360._0_8_ != local_360 + 0x10) {
        operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
      }
      Json::Value::~Value((Value *)&local_220);
    }
    if ((debug->OutputFile)._M_string_length != 0) {
      std::ofstream::ofstream(&local_220,(debug->OutputFile)._M_dataplus._M_p,_S_out);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_220,(char *)local_380._0_8_,
                 CONCAT44(local_380._12_4_,local_380._8_4_));
      local_220.int_ = _VTT;
      *(undefined8 *)(local_218 + *(long *)(_VTT + -0x18) + -8) = _vtable;
      std::filebuf::~filebuf(local_218);
      std::ios_base::~ios_base(local_128);
    }
    Json::Value::~Value((Value *)(local_360 + 0x20));
  }
  (**connection->_vptr_cmConnection)(connection,local_380);
  if ((undefined1 *)local_380._0_8_ != local_380 + 0x10) {
    operator_delete((void *)local_380._0_8_,local_380._16_8_ + 1);
  }
  Json::FastWriter::~FastWriter(&local_318);
  return;
}

Assistant:

void cmServer::WriteJsonObject(cmConnection* connection,
                               const Json::Value& jsonValue,
                               const DebugInfo* debug) const
{
  Json::FastWriter writer;

  auto beforeJson = uv_hrtime();
  std::string result = writer.write(jsonValue);

  if (debug) {
    Json::Value copy = jsonValue;
    if (debug->PrintStatistics) {
      Json::Value stats = Json::objectValue;
      auto endTime = uv_hrtime();

      stats["jsonSerialization"] = double(endTime - beforeJson) / 1000000.0;
      stats["totalTime"] = double(endTime - debug->StartTime) / 1000000.0;
      stats["size"] = static_cast<int>(result.size());
      if (!debug->OutputFile.empty()) {
        stats["dumpFile"] = debug->OutputFile;
      }

      copy["zzzDebug"] = stats;

      result = writer.write(copy); // Update result to include debug info
    }

    if (!debug->OutputFile.empty()) {
      cmsys::ofstream myfile(debug->OutputFile.c_str());
      myfile << result;
    }
  }

  connection->WriteData(result);
}